

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

bool __thiscall
ClipperLib::Clipper::Execute
          (Clipper *this,ClipType clipType,PolyTree *polytree,PolyFillType subjFillType,
          PolyFillType clipFillType)

{
  uint uVar1;
  bool succeeded;
  PolyFillType clipFillType_local;
  PolyFillType subjFillType_local;
  PolyTree *polytree_local;
  ClipType clipType_local;
  Clipper *this_local;
  
  if ((this->m_ExecuteLocked & 1U) == 0) {
    this->m_ExecuteLocked = true;
    this->m_SubjFillType = subjFillType;
    this->m_ClipFillType = clipFillType;
    this->m_ClipType = clipType;
    this->m_UsingPolyTree = true;
    uVar1 = (**this->_vptr_Clipper)();
    this_local._7_1_ = (bool)((byte)uVar1 & 1);
    if ((uVar1 & 1) != 0) {
      BuildResult2(this,polytree);
    }
    ClipperBase::DisposeAllOutRecs
              ((ClipperBase *)((long)&this->_vptr_Clipper + (long)this->_vptr_Clipper[-3]));
    this->m_ExecuteLocked = false;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Clipper::Execute(ClipType clipType, PolyTree& polytree,
    PolyFillType subjFillType, PolyFillType clipFillType)
{
  if( m_ExecuteLocked ) return false;
  m_ExecuteLocked = true;
  m_SubjFillType = subjFillType;
  m_ClipFillType = clipFillType;
  m_ClipType = clipType;
  m_UsingPolyTree = true;
  bool succeeded = ExecuteInternal();
  if (succeeded) BuildResult2(polytree);
  DisposeAllOutRecs();
  m_ExecuteLocked = false;
  return succeeded;
}